

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

bool __thiscall
mpt::unique_array<mpt::reference<mpt::metatype>_>::reserve
          (unique_array<mpt::reference<mpt::metatype>_> *this,long len)

{
  int iVar1;
  content<mpt::reference<mpt::metatype>_> *ref;
  long lVar2;
  undefined4 extraout_var;
  content<mpt::reference<mpt::metatype>_> *n;
  content<mpt::reference<mpt::metatype>_> *c;
  long len_local;
  unique_array<mpt::reference<mpt::metatype>_> *this_local;
  
  ref = reference<mpt::content<mpt::reference<mpt::metatype>_>_>::detach(&this->_ref);
  if (ref == (content<mpt::reference<mpt::metatype>_> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    c = (content<mpt::reference<mpt::metatype>_> *)len;
    if (len < 0) {
      lVar2 = length(this);
      c = (content<mpt::reference<mpt::metatype>_> *)(lVar2 + len);
      if ((long)c < 0) {
        reference<mpt::content<mpt::reference<mpt::metatype>_>_>::set_instance(&this->_ref,ref);
        return false;
      }
    }
    iVar1 = (*(ref->super_buffer)._vptr_buffer[3])(ref,(long)c << 3);
    if ((content<mpt::reference<mpt::metatype>_> *)CONCAT44(extraout_var,iVar1) ==
        (content<mpt::reference<mpt::metatype>_> *)0x0) {
      reference<mpt::content<mpt::reference<mpt::metatype>_>_>::set_instance(&this->_ref,ref);
      this_local._7_1_ = true;
    }
    else {
      reference<mpt::content<mpt::reference<mpt::metatype>_>_>::set_instance
                (&this->_ref,(content<mpt::reference<mpt::metatype>_> *)CONCAT44(extraout_var,iVar1)
                );
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool reserve(long len)
	{
		content<T> *c;
		if (!(c = _ref.detach())) {
			return false;
		}
		if (len < 0
		    && (len += length()) < 0) {
			_ref.set_instance(c);
			return false;
		}
		content<T> *n;
		if ((n = c->detach(len * sizeof(T)))) {
			_ref.set_instance(n);
			return true;
		}
		_ref.set_instance(c);
		return true;
	}